

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

asn_strtol_result_e asn_strtol_lim(char *str,char **end,long *lp)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  pbVar1 = (byte *)*end;
  if (pbVar1 <= str) {
    return ASN_STRTOL_ERROR_INVAL;
  }
  uVar2 = 7;
  if (*str == '+') {
    iVar3 = 1;
    uVar2 = 7;
  }
  else {
    if (*str != '-') {
      iVar3 = 1;
      goto LAB_00140a8a;
    }
    iVar3 = -1;
    uVar2 = 8;
  }
  str = str + 1;
  if (pbVar1 <= str) {
    *end = str;
    return ASN_STRTOL_EXPECT_MORE;
  }
LAB_00140a8a:
  lVar5 = 0;
  do {
    if (pbVar1 <= str) {
      *end = str;
      *lp = lVar5 * iVar3;
      return ASN_STRTOL_OK;
    }
    if (9 < (byte)(*str - 0x30U)) {
      *end = str;
      *lp = lVar5 * iVar3;
      return ASN_STRTOL_EXTRA_DATA;
    }
    uVar6 = (byte)*str - 0x30;
    if (lVar5 < 0xccccccccccccccc) {
      iVar4 = iVar3;
      lVar5 = lVar5 * 10;
LAB_00140ae0:
      lVar5 = (ulong)uVar6 + lVar5;
      iVar3 = iVar4;
    }
    else {
      if ((lVar5 != 0xccccccccccccccc) || (uVar2 < uVar6)) {
        *end = str;
        return ASN_STRTOL_ERROR_RANGE;
      }
      iVar4 = 1;
      lVar5 = 0x7ffffffffffffff8;
      if (0 < iVar3) goto LAB_00140ae0;
      lVar5 = -0x7ffffffffffffff8 - (ulong)uVar6;
      iVar3 = 1;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

enum asn_strtol_result_e
asn_strtol_lim(const char *str, const char **end, long *lp) {
	int sign = 1;
	long l;

	const long upper_boundary = LONG_MAX / 10;
	long last_digit_max = LONG_MAX % 10;

	if(str >= *end) return ASN_STRTOL_ERROR_INVAL;

	switch(*str) {
	case '-':
		last_digit_max++;
		sign = -1;
		/* FALL THROUGH */
	case '+':
		str++;
		if(str >= *end) {
			*end = str;
			return ASN_STRTOL_EXPECT_MORE;
		}
	}

	for(l = 0; str < (*end); str++) {
		switch(*str) {
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39: {
			int d = *str - '0';
			if(l < upper_boundary) {
				l = l * 10 + d;
			} else if(l == upper_boundary) {
				if(d <= last_digit_max) {
					if(sign > 0) {
						l = l * 10 + d;
					} else {
						sign = 1;
						l = -l * 10 - d;
					}
				} else {
					*end = str;
					return ASN_STRTOL_ERROR_RANGE;
				}
			} else {
				*end = str;
				return ASN_STRTOL_ERROR_RANGE;
			}
		    }
		    continue;
		default:
		    *end = str;
		    *lp = sign * l;
		    return ASN_STRTOL_EXTRA_DATA;
		}
	}

	*end = str;
	*lp = sign * l;
	return ASN_STRTOL_OK;
}